

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyStrnicmp(char *zLeft,char *zRight,sxu32 SLen)

{
  byte bVar1;
  byte bVar2;
  ushort **ppuVar3;
  __int32_t **pp_Var4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  byte *pbVar10;
  uint uVar11;
  byte *local_70;
  byte *local_68;
  byte *local_60;
  int local_48;
  int local_40;
  int local_38;
  
  if (zLeft != (char *)0x0) {
    if ((zRight != (char *)0x0 && *zLeft != '\0') && (*zRight != '\0')) {
      if (SLen == 0) {
        return 0;
      }
      local_38 = SLen - 1;
      local_40 = SLen - 2;
      local_48 = SLen - 3;
      lVar8 = 0;
      local_68 = (byte *)zLeft;
      local_60 = (byte *)zRight;
      while( true ) {
        bVar1 = zLeft[lVar8];
        uVar5 = (ulong)bVar1;
        uVar9 = (uint)bVar1;
        if (uVar5 == 0) break;
        bVar2 = zRight[lVar8];
        uVar6 = (ulong)bVar2;
        uVar11 = (uint)bVar2;
        if (uVar6 == 0) break;
        if ((bVar1 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar5 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar9 = (*pp_Var4)[uVar5];
        }
        if ((bVar2 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar6 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar11 = (*pp_Var4)[uVar6];
        }
        if (uVar9 != uVar11) {
          local_70 = (byte *)(zRight + lVar8);
          pbVar10 = (byte *)(zLeft + lVar8);
          goto LAB_00115c14;
        }
        iVar7 = (int)lVar8;
        if (local_38 == iVar7) {
          return 0;
        }
        local_70 = local_60 + 1;
        bVar1 = zLeft[lVar8 + 1];
        uVar5 = (ulong)bVar1;
        uVar9 = (uint)bVar1;
        if (uVar5 == 0) {
          pbVar10 = (byte *)(zLeft + lVar8 + 1);
          goto LAB_00115c14;
        }
        bVar2 = zRight[lVar8 + 1];
        uVar6 = (ulong)bVar2;
        uVar11 = (uint)bVar2;
        pbVar10 = local_68 + 1;
        if (uVar6 == 0) goto LAB_00115c14;
        if ((bVar1 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar5 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar9 = (*pp_Var4)[uVar5];
        }
        if ((bVar2 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar6 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar11 = (*pp_Var4)[uVar6];
        }
        if (uVar9 != uVar11) goto LAB_00115c14;
        if (local_40 == iVar7) {
          return 0;
        }
        local_70 = local_60 + 2;
        bVar1 = zLeft[lVar8 + 2];
        uVar5 = (ulong)bVar1;
        uVar9 = (uint)bVar1;
        pbVar10 = local_68 + 2;
        if (uVar5 == 0) goto LAB_00115c14;
        bVar2 = zRight[lVar8 + 2];
        uVar6 = (ulong)bVar2;
        uVar11 = (uint)bVar2;
        if (uVar6 == 0) goto LAB_00115c14;
        if ((bVar1 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar5 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar9 = (*pp_Var4)[uVar5];
        }
        if ((bVar2 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar6 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar11 = (*pp_Var4)[uVar6];
        }
        if (uVar9 != uVar11) {
          pbVar10 = (byte *)(zLeft + lVar8 + 2);
          goto LAB_00115c14;
        }
        if (local_48 == iVar7) {
          return 0;
        }
        local_70 = local_60 + 3;
        bVar1 = zLeft[lVar8 + 3];
        uVar5 = (ulong)bVar1;
        uVar9 = (uint)bVar1;
        if (uVar5 == 0) {
          pbVar10 = (byte *)(zLeft + lVar8 + 3);
          goto LAB_00115c14;
        }
        bVar2 = zRight[lVar8 + 3];
        uVar6 = (ulong)bVar2;
        uVar11 = (uint)bVar2;
        pbVar10 = local_68 + 3;
        if (uVar6 == 0) goto LAB_00115c14;
        if ((bVar1 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar5 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar9 = (*pp_Var4)[uVar5];
        }
        if ((bVar2 < 0xc0) &&
           (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar6 * 2 + 1) & 1) != 0)) {
          pp_Var4 = __ctype_tolower_loc();
          uVar11 = (*pp_Var4)[uVar6];
        }
        if (uVar9 != uVar11) goto LAB_00115c14;
        local_68 = local_68 + 4;
        local_60 = local_60 + 4;
        lVar8 = lVar8 + 4;
        if (SLen == (sxu32)lVar8) {
          return 0;
        }
      }
      local_70 = local_60;
      pbVar10 = local_68;
LAB_00115c14:
      uVar5 = (ulong)*pbVar10;
      uVar9 = (uint)*pbVar10;
      if ((uVar5 < 0xc0) &&
         (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar5 * 2 + 1) & 1) != 0)) {
        pp_Var4 = __ctype_tolower_loc();
        uVar9 = (*pp_Var4)[uVar5];
      }
      uVar5 = (ulong)*local_70;
      uVar11 = (uint)*local_70;
      if ((uVar5 < 0xc0) &&
         (ppuVar3 = __ctype_b_loc(), (*(byte *)((long)*ppuVar3 + uVar5 * 2 + 1) & 1) != 0)) {
        pp_Var4 = __ctype_tolower_loc();
        uVar11 = (*pp_Var4)[uVar5];
      }
      return uVar9 - uVar11;
    }
    if (*zLeft != '\0') {
      return 1;
    }
  }
  if (zRight == (char *)0x0) {
    return 0;
  }
  return -(uint)(*zRight != '\0');
}

Assistant:

JX9_PRIVATE sxi32 SyStrnicmp(const char *zLeft, const char *zRight, sxu32 SLen)
{
  	register unsigned char *p = (unsigned char *)zLeft;
	register unsigned char *q = (unsigned char *)zRight;
	
	if( SX_EMPTY_STR(p) || SX_EMPTY_STR(q) ){
		return SX_EMPTY_STR(p)? SX_EMPTY_STR(q) ? 0 : -1 :1;
	}
	for(;;){
		if( !SLen ){ return 0; }if( !*p || !*q || SyCharToLower(*p) != SyCharToLower(*q) ){ break; }p++;q++;--SLen;
		if( !SLen ){ return 0; }if( !*p || !*q || SyCharToLower(*p) != SyCharToLower(*q) ){ break; }p++;q++;--SLen;
		if( !SLen ){ return 0; }if( !*p || !*q || SyCharToLower(*p) != SyCharToLower(*q) ){ break; }p++;q++;--SLen;
		if( !SLen ){ return 0; }if( !*p || !*q || SyCharToLower(*p) != SyCharToLower(*q) ){ break; }p++;q++;--SLen;
		
	}
	return (sxi32)(SyCharToLower(p[0]) - SyCharToLower(q[0]));
}